

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_State_Test::TestBody(InterpreterTestSuite_PC_State_Test *this)

{
  string *this_00;
  State SVar1;
  undefined8 uVar2;
  TypedExpectation<ot::commissioner::State_()> *pTVar3;
  ActionInterface<ot::commissioner::State_()> *pAVar4;
  char *pcVar5;
  char *pcVar6;
  Value value;
  TestContext ctx;
  Expression local_288;
  undefined1 local_270 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_248;
  char local_238 [16];
  _Any_data local_228;
  pointer local_218;
  _Any_data local_208;
  pointer local_1f8;
  undefined1 local_1e8 [16];
  _Manager_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  State *local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  State *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  State *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  State *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&((local_160.mDefaultCommissionerObject.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              gmock10_GetState_82).super_UntypedFunctionMockerBase,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(local_160.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 gmock10_GetState_82;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<ot::commissioner::State_()>::InternalExpectedAt
                     ((MockSpec<ot::commissioner::State_()> *)&local_288,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x3bd,"*ctx.mDefaultCommissionerObject","GetState()");
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::Times(pTVar3,4);
  local_170 = (State *)operator_new(1);
  *local_170 = kActive;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ot::commissioner::State*>
            (&local_168,local_170);
  pAVar4 = (ActionInterface<ot::commissioner::State_()> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b438;
  SVar1 = *local_170;
  *(State *)&pAVar4[1]._vptr_ActionInterface = SVar1;
  *(State *)((long)&pAVar4[1]._vptr_ActionInterface + 1) = SVar1;
  testing::Action<ot::commissioner::State_()>::Action
            ((Action<ot::commissioner::State_()> *)local_1e8,pAVar4);
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar3,(Action<ot::commissioner::State_()> *)local_1e8);
  local_180 = (State *)operator_new(1);
  *local_180 = kPetitioning;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ot::commissioner::State*>
            (&local_178,local_180);
  pAVar4 = (ActionInterface<ot::commissioner::State_()> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b438;
  SVar1 = *local_180;
  *(State *)&pAVar4[1]._vptr_ActionInterface = SVar1;
  *(State *)((long)&pAVar4[1]._vptr_ActionInterface + 1) = SVar1;
  testing::Action<ot::commissioner::State_()>::Action
            ((Action<ot::commissioner::State_()> *)local_270,pAVar4);
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar3,(Action<ot::commissioner::State_()> *)local_270);
  local_190 = (State *)operator_new(1);
  *local_190 = kConnected;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ot::commissioner::State*>
            (&local_188,local_190);
  pAVar4 = (ActionInterface<ot::commissioner::State_()> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b438;
  SVar1 = *local_190;
  *(State *)&pAVar4[1]._vptr_ActionInterface = SVar1;
  *(State *)((long)&pAVar4[1]._vptr_ActionInterface + 1) = SVar1;
  testing::Action<ot::commissioner::State_()>::Action
            ((Action<ot::commissioner::State_()> *)&local_208,pAVar4);
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar3,(Action<ot::commissioner::State_()> *)&local_208);
  local_1a0 = (State *)operator_new(1);
  *local_1a0 = kDisabled;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ot::commissioner::State*>
            (&local_198,local_1a0);
  pAVar4 = (ActionInterface<ot::commissioner::State_()> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b438;
  SVar1 = *local_1a0;
  *(State *)&pAVar4[1]._vptr_ActionInterface = SVar1;
  *(State *)((long)&pAVar4[1]._vptr_ActionInterface + 1) = SVar1;
  testing::Action<ot::commissioner::State_()>::Action
            ((Action<ot::commissioner::State_()> *)&local_228,pAVar4);
  testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
            (pTVar3,(Action<ot::commissioner::State_()> *)&local_228);
  if (local_218 != (pointer)0x0) {
    (*(code *)local_218)(&local_228,&local_228,3);
  }
  if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
  }
  if (local_1f8 != (pointer)0x0) {
    (*(code *)local_1f8)(&local_208,&local_208,3);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  if ((_Manager_type)local_260._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_260._M_allocated_capacity)(local_270,local_270,3);
  }
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_1d8 != (_Manager_type)0x0) {
    (*local_1d8)((_Any_data *)local_1e8,(_Any_data *)local_1e8,__destroy_functor);
  }
  if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
  }
  local_218 = (pointer)0x0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = (undefined8 *)0x0;
  local_1e8._8_8_ = &local_1d0;
  local_1e8._0_4_ = 0;
  local_1d8 = (_Manager_type)0x0;
  local_1d0._M_local_buf[0] = '\0';
  local_1c0._M_p = (pointer)&local_1b0;
  local_1b8 = 0;
  local_1b0._M_local_buf[0] = '\0';
  local_270._0_8_ = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"state","");
  ot::commissioner::Interpreter::ParseExpression
            (&local_288,&local_160.mInterpreter,(string *)local_270);
  local_1f8 = local_218;
  local_208._8_8_ = local_228._8_8_;
  local_208._M_unused._0_8_ = local_228._M_unused._0_8_;
  local_218 = local_288.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228._M_unused._M_object =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228._8_8_ =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_270,&local_160.mInterpreter,(Expression *)&local_228);
  this_00 = (string *)(local_1e8 + 8);
  local_1e8._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=(this_00,(string *)(local_270 + 8));
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  pcVar6 = local_260._M_local_buf + 8;
  if ((char *)local_270._8_8_ != pcVar6) {
    operator_delete((void *)local_270._8_8_);
  }
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_270,(Value *)local_1e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208._M_pod_data,"\"active\"","value.ToString().c_str()","active",
             (char *)local_270._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  if (local_208._M_pod_data[0] == '\0') {
    testing::Message::Message((Message *)local_270);
    if ((undefined8 *)local_208._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_208._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3c8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_208._8_8_;
  if ((undefined8 *)local_208._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_208._8_8_ != (undefined8 *)(local_208._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_208._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"state","");
  ot::commissioner::Interpreter::ParseExpression
            (&local_288,&local_160.mInterpreter,(string *)local_270);
  local_1f8 = local_218;
  local_208._8_8_ = local_228._8_8_;
  local_208._M_unused._0_8_ = local_228._M_unused._0_8_;
  local_218 = local_288.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228._M_unused._M_object =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228._8_8_ =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_270,&local_160.mInterpreter,(Expression *)&local_228);
  local_1e8._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=(this_00,(string *)(local_270 + 8));
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if ((char *)local_270._8_8_ != pcVar6) {
    operator_delete((void *)local_270._8_8_);
  }
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_270,(Value *)local_1e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208._M_pod_data,"\"petitioning\"","value.ToString().c_str()",
             "petitioning",(char *)local_270._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  if (local_208._M_pod_data[0] == '\0') {
    testing::Message::Message((Message *)local_270);
    if ((pointer)local_208._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_208._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3cc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_208._8_8_;
  if ((pointer)local_208._8_8_ != (pointer)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)local_208._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_208._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_208._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"state","");
  ot::commissioner::Interpreter::ParseExpression
            (&local_288,&local_160.mInterpreter,(string *)local_270);
  local_1f8 = local_218;
  local_208._8_8_ = local_228._8_8_;
  local_208._M_unused._0_8_ = local_228._M_unused._0_8_;
  local_218 = local_288.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228._M_unused._M_object =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228._8_8_ =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_270,&local_160.mInterpreter,(Expression *)&local_228);
  local_1e8._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=(this_00,(string *)(local_270 + 8));
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if ((char *)local_270._8_8_ != pcVar6) {
    operator_delete((void *)local_270._8_8_);
  }
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_270,(Value *)local_1e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208._M_pod_data,"\"connected\"","value.ToString().c_str()",
             "connected",(char *)local_270._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  if (local_208._M_pod_data[0] == '\0') {
    testing::Message::Message((Message *)local_270);
    if ((pointer)local_208._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_208._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3d0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_208._8_8_;
  if ((pointer)local_208._8_8_ != (pointer)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)local_208._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_208._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_208._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"state","");
  ot::commissioner::Interpreter::ParseExpression
            (&local_288,&local_160.mInterpreter,(string *)local_270);
  local_1f8 = local_218;
  local_208._8_8_ = local_228._8_8_;
  local_208._M_unused._0_8_ = local_228._M_unused._0_8_;
  local_218 = local_288.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228._M_unused._M_object =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228._8_8_ =
       local_288.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_270,&local_160.mInterpreter,(Expression *)&local_228);
  local_1e8._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=(this_00,(string *)(local_270 + 8));
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if ((char *)local_270._8_8_ != pcVar6) {
    operator_delete((void *)local_270._8_8_);
  }
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_270,(Value *)local_1e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208._M_pod_data,"\"disabled\"","value.ToString().c_str()","disabled",
             (char *)local_270._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ != &local_260) {
    operator_delete((void *)local_270._0_8_);
  }
  if (local_208._M_pod_data[0] == '\0') {
    testing::Message::Message((Message *)local_270);
    if ((pointer)local_208._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_208._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3d4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_208._8_8_;
  if ((pointer)local_208._8_8_ != (pointer)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)local_208._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_208._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_208._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._8_8_ != &local_1d0) {
    operator_delete((void *)local_1e8._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_228);
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_State)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetState())
        .Times(4)
        .WillOnce(Return(State::kActive))
        .WillOnce(Return(State::kPetitioning))
        .WillOnce(Return(State::kConnected))
        .WillOnce(Return(State::kDisabled));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("active", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("petitioning", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("connected", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("disabled", value.ToString().c_str());
}